

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_3
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *this_00;
  double *in_RCX;
  double dVar4;
  VectorXd b5;
  VectorXd Rho_temp;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  int i;
  MatrixXd L_6x5;
  EigenBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffc78;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffc80;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc88;
  SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>_>
  *in_stack_fffffffffffffc90;
  int *in_stack_fffffffffffffc98;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffca0;
  double local_358;
  undefined8 in_stack_fffffffffffffcb0;
  MatrixType *in_stack_fffffffffffffcb8;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffffcc0;
  int local_44;
  
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90);
  for (local_44 = 0; local_44 < 6; local_44 = local_44 + 1) {
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d21bc);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d21f4);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d222d);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d2266);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d229f);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d22d8);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d2311);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d234a);
    *pSVar2 = dVar4;
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>,_0> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d2383);
    dVar4 = *pdVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78,0x8d23b3);
    *pSVar2 = dVar4;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (uint)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc80,
             (EigenBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffc78);
  Eigen::SolverBase<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,-1,-1,0,-1,-1>,2>>>::
  solve<Eigen::Matrix<double,_1,1,0,_1,1>>(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>,2>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78)
  ;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
  if (0.0 <= *pSVar3) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    dVar4 = sqrt(*pSVar3);
    *in_RCX = dVar4;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    if (*pSVar3 <= 0.0) {
      dVar4 = 0.0;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
      dVar4 = sqrt(*pSVar3);
    }
    in_RCX[1] = dVar4;
  }
  else {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    dVar4 = sqrt(-*pSVar3);
    *in_RCX = dVar4;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
    if (0.0 <= *pSVar3) {
      local_358 = 0.0;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
      local_358 = sqrt(-*pSVar3);
    }
    in_RCX[1] = local_358;
  }
  this_00 = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      (in_stack_fffffffffffffc80,(Index)in_stack_fffffffffffffc78);
  if ((double)(this_00->
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>).
              m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data < 0.0) {
    *in_RCX = -*in_RCX;
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffc78);
  in_RCX[2] = *pSVar3 / *in_RCX;
  in_RCX[3] = 0.0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x8d272b);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x8d2738);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x8d2752);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_3(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x5(6,5);

  for(int i = 0; i < 6; i++)
  {
    L_6x5(i,0) = L_6x10(i,0);
    L_6x5(i,1) = L_6x10(i,1);
    L_6x5(i,2) = L_6x10(i,2);
    L_6x5(i,3) = L_6x10(i,3);
    L_6x5(i,4) = L_6x10(i,4);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x5,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b5 = SVD.solve(Rho_temp);

  if (b5[0] < 0)
  {
    betas[0] = sqrt(-b5[0]);
    betas[1] = (b5[2] < 0) ? sqrt(-b5[2]) : 0.0;
  }
  else
  {
    betas[0] = sqrt(b5[0]);
    betas[1] = (b5[2] > 0) ? sqrt(b5[2]) : 0.0;
  }
  if (b5[1] < 0) betas[0] = -betas[0];
  betas[2] = b5[3] / betas[0];
  betas[3] = 0.0;
}